

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

void arm_max_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  byte *pbVar1;
  
  cortex_a15_initfn(uc,obj);
  *(uint *)(obj[1].tb_jmp_cache + 0x63a) =
       *(uint *)(obj[1].tb_jmp_cache + 0x63a) & 0xf0ffffff | 0x1000000;
  pbVar1 = (byte *)((long)obj[1].tb_jmp_cache + 0x2f9b);
  *pbVar1 = *pbVar1 | 8;
  *(uint *)((long)obj[1].tb_jmp_cache + 0x31b4) =
       *(uint *)((long)obj[1].tb_jmp_cache + 0x31b4) & 0xf0000f | 0x11011120;
  *(uint *)(obj[1].tb_jmp_cache + 0x637) =
       *(uint *)(obj[1].tb_jmp_cache + 0x637) & 0xfff00000 | 0x11111;
  *(uint *)((long)obj[1].tb_jmp_cache + 0x31d4) =
       *(uint *)((long)obj[1].tb_jmp_cache + 0x31d4) & 0xf0ffffff | 0x2000000;
  *(undefined1 *)(obj[1].tb_jmp_cache + 0x63b) = 0x43;
  *(uint *)(obj[1].tb_jmp_cache + 0x639) =
       *(uint *)(obj[1].tb_jmp_cache + 0x639) & 0xfff0ffff | 0x20000;
  *(uint *)((long)obj[1].tb_jmp_cache + 0x31cc) =
       *(uint *)((long)obj[1].tb_jmp_cache + 0x31cc) & 0xfff00f0f | 0x11010;
  return;
}

Assistant:

static void arm_max_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    {
        cortex_a15_initfn(uc, obj);

        /* old-style VFP short-vector support */
        FIELD_DP32(cpu->isar.mvfr0, MVFR0, FPSHVEC, 1, cpu->isar.mvfr0);

// Unicorn: Enable this on ARM_MAX
//#ifdef CONFIG_USER_ONLY
        /* We don't set these in system emulation mode for the moment,
         * since we don't correctly set (all of) the ID registers to
         * advertise them.
         */
        set_feature(&cpu->env, ARM_FEATURE_V8);
        {
            uint32_t t;

            t = cpu->isar.id_isar5;
            FIELD_DP32(t, ID_ISAR5, AES, 2, t);
            FIELD_DP32(t, ID_ISAR5, SHA1, 1, t);
            FIELD_DP32(t, ID_ISAR5, SHA2, 1, t);
            FIELD_DP32(t, ID_ISAR5, CRC32, 1, t);
            FIELD_DP32(t, ID_ISAR5, RDM, 1, t);
            FIELD_DP32(t, ID_ISAR5, VCMA, 1, t);
            cpu->isar.id_isar5 = t;

            t = cpu->isar.id_isar6;
            FIELD_DP32(t, ID_ISAR6, JSCVT, 1, t);
            FIELD_DP32(t, ID_ISAR6, DP, 1, t);
            FIELD_DP32(t, ID_ISAR6, FHM, 1, t);
            FIELD_DP32(t, ID_ISAR6, SB, 1, t);
            FIELD_DP32(t, ID_ISAR6, SPECRES, 1, t);
            cpu->isar.id_isar6 = t;

            t = cpu->isar.mvfr1;
            FIELD_DP32(t, MVFR1, FPHP, 2, t);     /* v8.0 FP support */
            cpu->isar.mvfr1 = t;

            t = cpu->isar.mvfr2;
            FIELD_DP32(t, MVFR2, SIMDMISC, 3, t); /* SIMD MaxNum */
            FIELD_DP32(t, MVFR2, FPMISC, 4, t);   /* FP MaxNum */
            cpu->isar.mvfr2 = t;

            t = cpu->isar.id_mmfr3;
            FIELD_DP32(t, ID_MMFR3, PAN, 2, t); /* ATS1E1 */
            cpu->isar.id_mmfr3 = t;

            t = cpu->isar.id_mmfr4;
            FIELD_DP32(t, ID_MMFR4, HPDS, 1, t); /* AA32HPD */
            FIELD_DP32(t, ID_MMFR4, AC2, 1, t); /* ACTLR2, HACTLR2 */
            FIELD_DP32(t, ID_MMFR4, CNP, 1, t); /* TTCNP */
            cpu->isar.id_mmfr4 = t;
        }
//#endif
    }
}